

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O2

int __thiscall QTreeViewPrivate::viewIndex(QTreeViewPrivate *this,QModelIndex *_index)

{
  ulong uVar1;
  QTreeViewItem *pQVar2;
  uint uVar3;
  bool bVar4;
  int iVar5;
  quintptr *pqVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  long in_FS_OFFSET;
  undefined1 *local_48;
  undefined1 *puStack_40;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  bVar4 = QModelIndex::isValid(_index);
  iVar9 = -1;
  if ((bVar4) && (uVar1 = (this->viewItems).d.size, uVar1 != 0)) {
    local_38.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    lVar11 = 0;
    QModelIndex::sibling((QModelIndex *)&local_48,_index,_index->r,0);
    iVar5 = this->lastViewedItem;
    iVar9 = (int)uVar1;
    uVar3 = iVar9 - iVar5;
    if ((int)(iVar5 - 1U) < iVar9 - iVar5) {
      uVar3 = iVar5 - 1U;
    }
    pQVar2 = (this->viewItems).d.ptr;
    uVar7 = 0;
    if (0 < (int)uVar3) {
      uVar7 = (ulong)uVar3;
    }
    pqVar6 = &pQVar2[iVar5].index.i;
    for (; -lVar11 != uVar7; lVar11 = lVar11 + -1) {
      iVar10 = (int)lVar11;
      if ((((QModelIndex *)(pqVar6 + -1))->r == (int)local_48) &&
         ((undefined1 *)*pqVar6 == puStack_40)) {
        iVar5 = iVar5 - iVar10;
        goto LAB_0053efe6;
      }
      iVar8 = iVar5 + -1 + iVar10;
      if ((pQVar2[iVar8].index.r == (int)local_48) &&
         ((undefined1 *)pQVar2[iVar8].index.i == puStack_40)) {
        iVar5 = iVar5 + iVar10 + -1;
        goto LAB_0053efe6;
      }
      pqVar6 = pqVar6 + 5;
    }
    uVar7 = 0;
    if (0 < (int)(iVar5 + uVar3)) {
      uVar7 = (ulong)(iVar5 + uVar3);
    }
    pqVar6 = &pQVar2[uVar7].index.i;
    for (; (long)uVar7 < (long)iVar9; uVar7 = uVar7 + 1) {
      if ((((QModelIndex *)(pqVar6 + -1))->r == (int)local_48) &&
         ((undefined1 *)*pqVar6 == puStack_40)) {
        iVar5 = (int)uVar7;
        goto LAB_0053efe6;
      }
      pqVar6 = pqVar6 + 5;
    }
    uVar7 = (ulong)(iVar5 - uVar3);
    if (iVar9 <= (int)(iVar5 - uVar3)) {
      uVar7 = uVar1 & 0xffffffff;
    }
    pqVar6 = &pQVar2[uVar7 - 1].index.i;
    iVar9 = -1;
    iVar10 = (int)uVar7;
    while (iVar5 = iVar10 + -1, 0 < iVar10) {
      if ((((QModelIndex *)(pqVar6 + -1))->r == (int)local_48) &&
         ((undefined1 *)*pqVar6 == puStack_40)) goto LAB_0053efe6;
      pqVar6 = pqVar6 + -5;
      iVar10 = iVar5;
    }
  }
LAB_0053efee:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return iVar9;
  }
  __stack_chk_fail();
LAB_0053efe6:
  this->lastViewedItem = iVar5;
  iVar9 = iVar5;
  goto LAB_0053efee;
}

Assistant:

int QTreeViewPrivate::viewIndex(const QModelIndex &_index) const
{
    if (!_index.isValid() || viewItems.isEmpty())
        return -1;

    const int totalCount = viewItems.size();
    const QModelIndex index = _index.sibling(_index.row(), 0);
    const int row = index.row();
    const quintptr internalId = index.internalId();

    // We start nearest to the lastViewedItem
    int localCount = qMin(lastViewedItem - 1, totalCount - lastViewedItem);
    for (int i = 0; i < localCount; ++i) {
        const QModelIndex &idx1 = viewItems.at(lastViewedItem + i).index;
        if (idx1.row() == row && idx1.internalId() == internalId) {
            lastViewedItem = lastViewedItem + i;
            return lastViewedItem;
        }
        const QModelIndex &idx2 = viewItems.at(lastViewedItem - i - 1).index;
        if (idx2.row() == row && idx2.internalId() == internalId) {
            lastViewedItem = lastViewedItem - i - 1;
            return lastViewedItem;
        }
    }

    for (int j = qMax(0, lastViewedItem + localCount); j < totalCount; ++j) {
        const QModelIndex &idx = viewItems.at(j).index;
        if (idx.row() == row && idx.internalId() == internalId) {
            lastViewedItem = j;
            return j;
        }
    }
    for (int j = qMin(totalCount, lastViewedItem - localCount) - 1; j >= 0; --j) {
        const QModelIndex &idx = viewItems.at(j).index;
        if (idx.row() == row && idx.internalId() == internalId) {
            lastViewedItem = j;
            return j;
        }
    }

    // nothing found
    return -1;
}